

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError FillInDevInfo(PaAlsaHostApiRepresentation *alsaApi,HwDevInfo *deviceHwInfo,int blocking,
                     PaAlsaDeviceInfo *devInfo,int *devIdx)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  int iVar3;
  PaAlsaDeviceInfo *pPVar5;
  snd_pcm_t *pcm;
  PaDeviceInfo **ppPVar4;
  
  pcm = (snd_pcm_t *)0x0;
  (devInfo->baseDeviceInfo).structVersion = -1;
  (devInfo->baseDeviceInfo).name = (char *)0x0;
  (devInfo->baseDeviceInfo).hostApi = -1;
  (devInfo->baseDeviceInfo).maxInputChannels = 0;
  (devInfo->baseDeviceInfo).maxOutputChannels = 0;
  (devInfo->baseDeviceInfo).defaultLowInputLatency = -1.0;
  (devInfo->baseDeviceInfo).defaultLowOutputLatency = -1.0;
  (devInfo->baseDeviceInfo).defaultHighInputLatency = -1.0;
  (devInfo->baseDeviceInfo).defaultHighOutputLatency = -1.0;
  (devInfo->baseDeviceInfo).defaultSampleRate = -1.0;
  if (deviceHwInfo->hasCapture != 0) {
    pPVar5 = (PaAlsaDeviceInfo *)0x0;
    iVar1 = OpenPcm(&pcm,deviceHwInfo->alsaName,SND_PCM_STREAM_CAPTURE,blocking,0);
    if (-1 < iVar1) {
      uVar2 = GropeDevice(pcm,deviceHwInfo->isPlug,StreamDirection_In,(int)devInfo,pPVar5);
      ppPVar4 = (PaDeviceInfo **)(ulong)uVar2;
      if (uVar2 != 0) goto LAB_0010d9f0;
    }
  }
  if (deviceHwInfo->hasPlayback != 0) {
    pPVar5 = (PaAlsaDeviceInfo *)0x0;
    iVar1 = OpenPcm(&pcm,deviceHwInfo->alsaName,SND_PCM_STREAM_PLAYBACK,blocking,0);
    if (-1 < iVar1) {
      uVar2 = GropeDevice(pcm,deviceHwInfo->isPlug,StreamDirection_Out,(int)devInfo,pPVar5);
      ppPVar4 = (PaDeviceInfo **)(ulong)uVar2;
      if (uVar2 != 0) goto LAB_0010d9f0;
    }
  }
  (devInfo->baseDeviceInfo).structVersion = 2;
  (devInfo->baseDeviceInfo).hostApi = alsaApi->hostApiIndex;
  (devInfo->baseDeviceInfo).name = deviceHwInfo->name;
  __s1 = deviceHwInfo->alsaName;
  devInfo->alsaName = __s1;
  ppPVar4 = (PaDeviceInfo **)(ulong)(uint)deviceHwInfo->isPlug;
  devInfo->isPlug = deviceHwInfo->isPlug;
  iVar1 = (devInfo->baseDeviceInfo).maxInputChannels;
  if (iVar1 < 1) {
    if ((devInfo->baseDeviceInfo).maxOutputChannels < 1) goto LAB_0010d9f0;
    if ((alsaApi->baseHostApiRep).info.defaultInputDevice != -1) goto LAB_0010d999;
  }
  else {
    if ((alsaApi->baseHostApiRep).info.defaultInputDevice != -1) {
LAB_0010d999:
      iVar3 = strcmp(__s1,"default");
      if ((iVar1 < 1) || (iVar3 != 0)) goto LAB_0010d9b6;
    }
    (alsaApi->baseHostApiRep).info.defaultInputDevice = *devIdx;
  }
LAB_0010d9b6:
  if ((alsaApi->baseHostApiRep).info.defaultOutputDevice == -1) {
    iVar1 = *devIdx;
LAB_0010d9d6:
    if (0 < (devInfo->baseDeviceInfo).maxOutputChannels) {
      (alsaApi->baseHostApiRep).info.defaultOutputDevice = iVar1;
    }
  }
  else {
    iVar3 = strcmp(__s1,"default");
    iVar1 = *devIdx;
    if (iVar3 == 0) goto LAB_0010d9d6;
  }
  ppPVar4 = (alsaApi->baseHostApiRep).deviceInfos;
  ppPVar4[iVar1] = &devInfo->baseDeviceInfo;
  *devIdx = iVar1 + 1;
LAB_0010d9f0:
  return (PaError)ppPVar4;
}

Assistant:

static PaError FillInDevInfo( PaAlsaHostApiRepresentation *alsaApi, HwDevInfo* deviceHwInfo, int blocking,
        PaAlsaDeviceInfo* devInfo, int* devIdx )
{
    PaError result = 0;
    PaDeviceInfo *baseDeviceInfo = &devInfo->baseDeviceInfo;
    snd_pcm_t *pcm = NULL;
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;

    PA_DEBUG(( "%s: Filling device info for: %s\n", __FUNCTION__, deviceHwInfo->name ));

    /* Zero fields */
    InitializeDeviceInfo( baseDeviceInfo );

    /* To determine device capabilities, we must open the device and query the
     * hardware parameter configuration space */

    /* Query capture */
    if( deviceHwInfo->hasCapture &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_CAPTURE, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_In, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for capture\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    /* Query playback */
    if( deviceHwInfo->hasPlayback &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_PLAYBACK, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_Out, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for playback\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    baseDeviceInfo->structVersion = 2;
    baseDeviceInfo->hostApi = alsaApi->hostApiIndex;
    baseDeviceInfo->name = deviceHwInfo->name;
    devInfo->alsaName = deviceHwInfo->alsaName;
    devInfo->isPlug = deviceHwInfo->isPlug;

    /* A: Storing pointer to PaAlsaDeviceInfo object as pointer to PaDeviceInfo object.
     * Should now be safe to add device info, unless the device supports neither capture nor playback
     */
    if( baseDeviceInfo->maxInputChannels > 0 || baseDeviceInfo->maxOutputChannels > 0 )
    {
        /* Make device default if there isn't already one or it is the ALSA "default" device */
        if( ( baseApi->info.defaultInputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxInputChannels > 0 )
        {
            baseApi->info.defaultInputDevice = *devIdx;
            PA_DEBUG(( "Default input device: %s\n", deviceHwInfo->name ));
        }
        if( ( baseApi->info.defaultOutputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxOutputChannels > 0 )
        {
            baseApi->info.defaultOutputDevice = *devIdx;
            PA_DEBUG(( "Default output device: %s\n", deviceHwInfo->name ));
        }
        PA_DEBUG(( "%s: Adding device %s: %d\n", __FUNCTION__, deviceHwInfo->name, *devIdx ));
        baseApi->deviceInfos[*devIdx] = (PaDeviceInfo *) devInfo;
        (*devIdx) += 1;
    }
    else
    {
        PA_DEBUG(( "%s: Skipped device: %s, all channels == 0\n", __FUNCTION__, deviceHwInfo->name ));
    }

end:
    return result;
}